

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_METAL_comparison_operations(Context *ctx,char *cmp)

{
  int mask_00;
  char local_1b8 [8];
  char code [128];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  uint local_6c;
  int local_68;
  int mask;
  int src0swiz [4];
  int writemask [4];
  int used_swiz [4];
  int origmask;
  SourceArgInfo *srcarg0;
  DestArgInfo *dst;
  int j;
  int i;
  char *cmp_local;
  Context *ctx_local;
  
  mask_00 = (ctx->dest_arg).writemask;
  memset(writemask + 2,0,0x10);
  src0swiz[2] = (ctx->dest_arg).writemask0;
  src0swiz[3] = (ctx->dest_arg).writemask1;
  writemask[0] = (ctx->dest_arg).writemask2;
  writemask[1] = (ctx->dest_arg).writemask3;
  local_68 = ctx->source_args[0].swizzle_x;
  mask = ctx->source_args[0].swizzle_y;
  src0swiz[0] = ctx->source_args[0].swizzle_z;
  src0swiz[1] = ctx->source_args[0].swizzle_w;
  for (dst._4_4_ = 0; dst._4_4_ < 4; dst._4_4_ = dst._4_4_ + 1) {
    local_6c = 1 << ((byte)dst._4_4_ & 0x1f);
    if ((src0swiz[(long)dst._4_4_ + 2] != 0) && (writemask[(long)dst._4_4_ + 2] == 0)) {
      writemask[(long)dst._4_4_ + 2] = 1;
      dst._0_4_ = dst._4_4_;
      while (dst._0_4_ = (int)dst + 1, (int)dst < 4) {
        if ((src0swiz[(long)(int)dst + 2] != 0) && ((&local_68)[dst._4_4_] == (&local_68)[(int)dst])
           ) {
          local_6c = 1 << ((byte)(int)dst & 0x1f) | local_6c;
          writemask[(long)(int)dst + 2] = 1;
        }
      }
      make_METAL_srcarg_string(ctx,0,1 << ((byte)dst._4_4_ & 0x1f),src1 + 0x38,0x40);
      make_METAL_srcarg_string(ctx,1,local_6c,src2 + 0x38,0x40);
      make_METAL_srcarg_string(ctx,2,local_6c,code + 0x78,0x40);
      set_dstarg_writemask(&ctx->dest_arg,local_6c);
      make_METAL_destarg_assign
                (ctx,local_1b8,0x80,"((%s %s) ? %s : %s)",src1 + 0x38,cmp,src2 + 0x38,code + 0x78);
      output_line(ctx,"%s",local_1b8);
    }
  }
  set_dstarg_writemask(&ctx->dest_arg,mask_00);
  return;
}

Assistant:

static void emit_METAL_comparison_operations(Context *ctx, const char *cmp)
{
    int i, j;
    DestArgInfo *dst = &ctx->dest_arg;
    const SourceArgInfo *srcarg0 = &ctx->source_args[0];
    const int origmask = dst->writemask;
    int used_swiz[4] = { 0, 0, 0, 0 };
    const int writemask[4] = { dst->writemask0, dst->writemask1,
                               dst->writemask2, dst->writemask3 };
    const int src0swiz[4] = { srcarg0->swizzle_x, srcarg0->swizzle_y,
                              srcarg0->swizzle_z, srcarg0->swizzle_w };

    for (i = 0; i < 4; i++)
    {
        int mask = (1 << i);

        if (!writemask[i]) continue;
        if (used_swiz[i]) continue;

        // This is a swizzle we haven't checked yet.
        used_swiz[i] = 1;

        // see if there are any other elements swizzled to match (.yyyy)
        for (j = i + 1; j < 4; j++)
        {
            if (!writemask[j]) continue;
            if (src0swiz[i] != src0swiz[j]) continue;
            mask |= (1 << j);
            used_swiz[j] = 1;
        } // for

        // okay, (mask) should be the writemask of swizzles we like.

        //return make_METAL_srcarg_string(ctx, idx, (1 << 0));

        char src0[64];
        char src1[64];
        char src2[64];
        make_METAL_srcarg_string(ctx, 0, (1 << i), src0, sizeof (src0));
        make_METAL_srcarg_string(ctx, 1, mask, src1, sizeof (src1));
        make_METAL_srcarg_string(ctx, 2, mask, src2, sizeof (src2));

        set_dstarg_writemask(dst, mask);

        char code[128];
        make_METAL_destarg_assign(ctx, code, sizeof (code),
                                 "((%s %s) ? %s : %s)",
                                 src0, cmp, src1, src2);
        output_line(ctx, "%s", code);
    } // for

    set_dstarg_writemask(dst, origmask);
}